

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

void __thiscall vector<sortitem>::growbuf(vector<sortitem> *this,int sz)

{
  int iVar1;
  int iVar2;
  sortitem *__dest;
  uchar *newbuf;
  int olen;
  int sz_local;
  vector<sortitem> *this_local;
  
  iVar1 = this->alen;
  if (this->alen == 0) {
    iVar2 = max<int>(8,sz);
    this->alen = iVar2;
  }
  else {
    while (this->alen < sz) {
      this->alen = this->alen << 1;
    }
  }
  if (iVar1 < this->alen) {
    __dest = (sortitem *)operator_new__((long)this->alen * 0x18);
    if (0 < iVar1) {
      memcpy(__dest,this->buf,(long)iVar1 * 0x18);
      if (this->buf != (sortitem *)0x0) {
        operator_delete__(this->buf);
      }
    }
    this->buf = __dest;
  }
  return;
}

Assistant:

void growbuf(int sz)
    {
        int olen = alen;
        if(!alen) alen = max(MINSIZE, sz);
        else while(alen < sz) alen *= 2;
        if(alen <= olen) return;
        uchar *newbuf = new uchar[alen*sizeof(T)];
        if(olen > 0)
        {
            memcpy(newbuf, (void *)buf, olen*sizeof(T));
            delete[] (uchar *)buf;
        }
        buf = (T *)newbuf;
    }